

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::multiDrawElementsBaseVertex
          (ReferenceContext *this,deUint32 mode,int *count,deUint32 type,void **indices,
          int primCount,int *baseVertex)

{
  int primCount_local;
  void **indices_local;
  deUint32 type_local;
  int *count_local;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  return;
}

Assistant:

void ReferenceContext::multiDrawElementsBaseVertex (deUint32 mode, const int* count, deUint32 type, const void** indices, int primCount, const int* baseVertex)
{
	DE_UNREF(mode);
	DE_UNREF(count);
	DE_UNREF(type);
	DE_UNREF(indices);
	DE_UNREF(primCount);
	DE_UNREF(baseVertex);

	// not supported in gles, prevent accidental use
	DE_ASSERT(false);
}